

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int run_array_container_andnot(run_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  run_container_t *prVar5;
  container_t *pcVar6;
  array_container_t *a_out;
  bitset_container_t *src_1_00;
  uint16_t uVar7;
  _Bool result_is_bitset;
  bitset_container_t *ans;
  array_container_t *ac;
  rle16_t rStack_58;
  uint8_t return_type;
  rle16_t local_54;
  uint local_50;
  uint local_4c;
  int32_t xstart;
  int32_t end;
  int32_t start;
  rle16_t rle;
  int xrlepos;
  int rlepos;
  run_container_t *answer;
  int arbitrary_threshold;
  int card;
  container_t **dst_local;
  array_container_t *src_2_local;
  run_container_t *src_1_local;
  
  iVar3 = run_container_cardinality(src_1);
  if (iVar3 < 0x21) {
    if (src_2->cardinality == 0) {
      prVar5 = run_container_clone(src_1);
      *dst = prVar5;
      src_1_local._4_4_ = 3;
    }
    else {
      iVar4 = array_container_cardinality(src_2);
      prVar5 = run_container_create_given_capacity(iVar3 + iVar4);
      rle.value = 0;
      rle.length = 0;
      start = 0;
      end = *(int32_t *)src_1->runs;
      xstart = end & 0xffff;
      local_4c = xstart + ((uint)end >> 0x10) + 1;
      local_50 = (uint)*src_2->array;
      while( true ) {
        bVar1 = false;
        if ((int)rle < src_1->n_runs) {
          bVar1 = start < src_2->cardinality;
        }
        uVar7 = (uint16_t)xstart;
        if (!bVar1) break;
        if (local_50 < local_4c) {
          if ((uint)xstart < local_50 + 1) {
            if ((uint)xstart < local_50) {
              iVar3 = prVar5->n_runs;
              prVar5->n_runs = iVar3 + 1;
              rStack_58.length = ((short)local_50 - uVar7) - 1;
              rStack_58.value = uVar7;
              prVar5->runs[iVar3] = rStack_58;
            }
            if (local_50 + 1 < local_4c) {
              xstart = local_50 + 1;
            }
            else {
              rle = (rle16_t)((int)rle + 1);
              if ((int)rle < src_1->n_runs) {
                xstart = (int32_t)src_1->runs[(int)rle].value;
                local_4c = xstart + (uint)src_1->runs[(int)rle].length + 1;
              }
            }
          }
          else {
            start = start + 1;
            if (start < src_2->cardinality) {
              local_50 = (uint)src_2->array[start];
            }
          }
        }
        else {
          iVar3 = prVar5->n_runs;
          prVar5->n_runs = iVar3 + 1;
          local_54.length = ((short)local_4c - uVar7) - 1;
          local_54.value = uVar7;
          prVar5->runs[iVar3] = local_54;
          rle = (rle16_t)((int)rle + 1);
          if ((int)rle < src_1->n_runs) {
            xstart = (int32_t)src_1->runs[(int)rle].value;
            local_4c = xstart + (uint)src_1->runs[(int)rle].length + 1;
          }
        }
      }
      if ((int)rle < src_1->n_runs) {
        iVar3 = prVar5->n_runs;
        prVar5->n_runs = iVar3 + 1;
        ac._6_2_ = ((short)local_4c - uVar7) - 1;
        ac._4_2_ = uVar7;
        prVar5->runs[iVar3] = ac._4_4_;
        rle = (rle16_t)((int)rle + 1);
        if ((int)rle < src_1->n_runs) {
          memcpy(prVar5->runs + prVar5->n_runs,src_1->runs + (int)rle,
                 (long)(src_1->n_runs - (int)rle) << 2);
          prVar5->n_runs = (src_1->n_runs - (int)rle) + prVar5->n_runs;
        }
      }
      pcVar6 = convert_run_to_efficient_container(prVar5,(uint8_t *)((long)&ac + 3));
      *dst = pcVar6;
      if (prVar5 != (run_container_t *)*dst) {
        run_container_free(prVar5);
      }
      src_1_local._4_4_ = (uint)ac._3_1_;
    }
  }
  else if (iVar3 < 0x1001) {
    a_out = array_container_create_given_capacity(iVar3);
    iVar3 = run_array_array_subtract(src_1,src_2,a_out);
    a_out->cardinality = iVar3;
    *dst = a_out;
    src_1_local._4_4_ = 2;
  }
  else {
    src_1_00 = bitset_container_from_run(src_1);
    _Var2 = bitset_array_container_iandnot(src_1_00,src_2,dst);
    src_1_local._4_4_ = 2;
    if (_Var2) {
      src_1_local._4_4_ = 1;
    }
  }
  return src_1_local._4_4_;
}

Assistant:

int run_array_container_andnot(
    const run_container_t *src_1, const array_container_t *src_2,
    container_t **dst
){
    // follows the Java impl as of June 2016

    int card = run_container_cardinality(src_1);
    const int arbitrary_threshold = 32;

    if (card <= arbitrary_threshold) {
        if (src_2->cardinality == 0) {
            *dst = run_container_clone(src_1);
            return RUN_CONTAINER_TYPE;
        }
        // Java's "lazyandNot.toEfficientContainer" thing
        run_container_t *answer = run_container_create_given_capacity(
            card + array_container_cardinality(src_2));

        int rlepos = 0;
        int xrlepos = 0;  // "x" is src_2
        rle16_t rle = src_1->runs[rlepos];
        int32_t start = rle.value;
        int32_t end = start + rle.length + 1;
        int32_t xstart = src_2->array[xrlepos];

        while ((rlepos < src_1->n_runs) && (xrlepos < src_2->cardinality)) {
            if (end <= xstart) {
                // output the first run
                answer->runs[answer->n_runs++] =
                    MAKE_RLE16(start, end - start - 1);
                rlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }
            } else if (xstart + 1 <= start) {
                // exit the second run
                xrlepos++;
                if (xrlepos < src_2->cardinality) {
                    xstart = src_2->array[xrlepos];
                }
            } else {
                if (start < xstart) {
                    answer->runs[answer->n_runs++] =
                        MAKE_RLE16(start, xstart - start - 1);
                }
                if (xstart + 1 < end) {
                    start = xstart + 1;
                } else {
                    rlepos++;
                    if (rlepos < src_1->n_runs) {
                        start = src_1->runs[rlepos].value;
                        end = start + src_1->runs[rlepos].length + 1;
                    }
                }
            }
        }
        if (rlepos < src_1->n_runs) {
            answer->runs[answer->n_runs++] = MAKE_RLE16(start, end - start - 1);
            rlepos++;
            if (rlepos < src_1->n_runs) {
                memcpy(answer->runs + answer->n_runs, src_1->runs + rlepos,
                       (src_1->n_runs - rlepos) * sizeof(rle16_t));
                answer->n_runs += (src_1->n_runs - rlepos);
            }
        }
        uint8_t return_type;
        *dst = convert_run_to_efficient_container(answer, &return_type);
        if (answer != *dst) run_container_free(answer);
        return return_type;
    }
    // else it's a bitmap or array

    if (card <= DEFAULT_MAX_SIZE) {
        array_container_t *ac = array_container_create_given_capacity(card);
        // nb Java code used a generic iterator-based merge to compute
        // difference
        ac->cardinality = run_array_array_subtract(src_1, src_2, ac);
        *dst = ac;
        return ARRAY_CONTAINER_TYPE;
    }
    bitset_container_t *ans = bitset_container_from_run(src_1);
    bool result_is_bitset = bitset_array_container_iandnot(ans, src_2, dst);
    return (result_is_bitset ? BITSET_CONTAINER_TYPE
                             : ARRAY_CONTAINER_TYPE);
}